

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,comment *note)

{
  ostream *poVar1;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((note->info)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_30,"",&local_31);
  }
  else {
    std::operator+(&local_30," ",&note->info);
  }
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}